

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O1

void __thiscall
SubCircuit<0>::explainAcantreachB
          (SubCircuit<0> *this,Clause *reason,int reasonIndex,vec<int> *A,vec<int> *B,int a1,int b1)

{
  IntVar *pIVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (A->sz != 0) {
    uVar5 = 0;
    do {
      if (B->sz != 0) {
        uVar4 = 0;
        do {
          if ((A->data[uVar5] != a1) || (B->data[uVar4] != b1)) {
            pIVar1 = this->x[A->data[uVar5]].var;
            uVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                              (pIVar1,(long)B->data[uVar4],0);
            if ((int)(*(uint *)reason >> 8) <= reasonIndex) {
              abort();
            }
            lVar3 = (long)reasonIndex;
            reasonIndex = reasonIndex + 1;
            reason->data[lVar3].x = uVar2 ^ 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < B->sz);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < A->sz);
  }
  return;
}

Assistant:

void explainAcantreachB(Clause* reason, int reasonIndex, vec<int> A, vec<int> B, int a1 = -1,
													int b1 = -1) {
		// fprintf(stderr, "explaining");
		for (unsigned int a = 0; a < A.size(); a++) {
			assert(A[a] < size && A[a] >= 0);
			for (unsigned int b = 0; b < B.size(); b++) {
				assert(B[b] < size && B[b] >= 0);
				if (A[a] != a1 || B[b] != b1) {
					assert(!x[A[a]].indomain(B[b]));
					// fprintf(stderr, "add %d not equal to %d\n", A[a], B[b]);
					(*reason)[reasonIndex++] = ~x[A[a]].getLit(B[b], LR_NE);
				}
			}
		}
		// fprintf(stderr, "done\n");
	}